

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigen.h
# Opt level: O1

EigenConformable<false> *
pybind11::detail::
EigenProps<Eigen::Ref<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>_>
::conformable(EigenConformable<false> *__return_storage_ptr__,array *a)

{
  int iVar1;
  ulong uVar2;
  ssize_t sVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  EigenIndex np_rows;
  
  iVar1 = *(int *)&(a->super_buffer).super_object.super_handle.m_ptr[1].ob_type;
  if ((long)iVar1 - 3U < 0xfffffffffffffffe) {
    __return_storage_ptr__->conformable = false;
    __return_storage_ptr__->rows = 0;
    __return_storage_ptr__->cols = 0;
    (__return_storage_ptr__->stride).m_outer.m_value = 0;
    (__return_storage_ptr__->stride).m_inner.m_value = 0;
    __return_storage_ptr__->negativestrides = false;
  }
  else {
    uVar2 = array::shape(a,0);
    if (iVar1 == 2) {
      sVar3 = array::shape(a,1);
      uVar4 = array::strides(a,0);
      uVar7 = uVar4 + 7;
      if (-1 < (long)uVar4) {
        uVar7 = uVar4;
      }
      uVar5 = array::strides(a,1);
      uVar4 = uVar5 + 7;
      if (-1 < (long)uVar5) {
        uVar4 = uVar5;
      }
      __return_storage_ptr__->conformable = true;
      __return_storage_ptr__->rows = uVar2;
      __return_storage_ptr__->cols = sVar3;
      (__return_storage_ptr__->stride).m_outer.m_value = 0;
      (__return_storage_ptr__->stride).m_inner.m_value = 0;
      __return_storage_ptr__->negativestrides = false;
      if (-1 < (long)(uVar4 | uVar7) >> 3) {
        (__return_storage_ptr__->stride).m_outer.m_value = (long)uVar4 >> 3;
        (__return_storage_ptr__->stride).m_inner.m_value = (long)uVar7 >> 3;
        return __return_storage_ptr__;
      }
    }
    else {
      sVar3 = array::strides(a,0);
      lVar6 = sVar3 + 7;
      if (-1 < sVar3) {
        lVar6 = sVar3;
      }
      __return_storage_ptr__->conformable = true;
      __return_storage_ptr__->rows = uVar2;
      __return_storage_ptr__->cols = 1;
      (__return_storage_ptr__->stride).m_outer.m_value = 0;
      (__return_storage_ptr__->stride).m_inner.m_value = 0;
      __return_storage_ptr__->negativestrides = false;
      if (-1 < (long)(uVar2 | lVar6 >> 3)) {
        (__return_storage_ptr__->stride).m_outer.m_value = uVar2;
        (__return_storage_ptr__->stride).m_inner.m_value = lVar6 >> 3;
        return __return_storage_ptr__;
      }
    }
    __return_storage_ptr__->negativestrides = true;
  }
  return __return_storage_ptr__;
}

Assistant:

static EigenConformable<row_major> conformable(const array &a) {
        const auto dims = a.ndim();
        if (dims < 1 || dims > 2)
            return false;

        if (dims == 2) { // Matrix type: require exact match (or dynamic)

            EigenIndex
                np_rows = a.shape(0),
                np_cols = a.shape(1),
                np_rstride = a.strides(0) / static_cast<ssize_t>(sizeof(Scalar)),
                np_cstride = a.strides(1) / static_cast<ssize_t>(sizeof(Scalar));
            if ((fixed_rows && np_rows != rows) || (fixed_cols && np_cols != cols))
                return false;

            return {np_rows, np_cols, np_rstride, np_cstride};
        }

        // Otherwise we're storing an n-vector.  Only one of the strides will be used, but whichever
        // is used, we want the (single) numpy stride value.
        const EigenIndex n = a.shape(0),
              stride = a.strides(0) / static_cast<ssize_t>(sizeof(Scalar));

        if (vector) { // Eigen type is a compile-time vector
            if (fixed && size != n)
                return false; // Vector size mismatch
            return {rows == 1 ? 1 : n, cols == 1 ? 1 : n, stride};
        }
        else if (fixed) {
            // The type has a fixed size, but is not a vector: abort
            return false;
        }
        else if (fixed_cols) {
            // Since this isn't a vector, cols must be != 1.  We allow this only if it exactly
            // equals the number of elements (rows is Dynamic, and so 1 row is allowed).
            if (cols != n) return false;
            return {1, n, stride};
        }
        else {
            // Otherwise it's either fully dynamic, or column dynamic; both become a column vector
            if (fixed_rows && rows != n) return false;
            return {n, 1, stride};
        }
    }